

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

VarPackedStruct * __thiscall
kratos::Generator::var_packed
          (Generator *this,string *var_name,shared_ptr<kratos::PackedStruct> *packed_struct_,
          uint32_t size)

{
  VarPackedStruct *pVVar1;
  initializer_list<unsigned_int> __l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  uint32_t local_30;
  allocator_type local_29;
  
  __l._M_len = 1;
  __l._M_array = &local_30;
  local_30 = size;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__l,&local_29);
  pVVar1 = var_packed(this,var_name,packed_struct_,&local_48);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pVVar1;
}

Assistant:

VarPackedStruct &Generator::var_packed(const std::string &var_name,
                                       const std::shared_ptr<PackedStruct> &packed_struct_,
                                       uint32_t size) {
    return var_packed(var_name, packed_struct_, std::vector<uint32_t>{size});
}